

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O2

void ncnn::convolution_transform_kernel_packed_int8_avx2
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  void *pvVar1;
  int k;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  int k_2;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  size_t _elemsize;
  int iVar16;
  undefined8 *puVar17;
  undefined1 (*pauVar18) [16];
  uint uVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [32];
  undefined1 in_ZMM7 [64];
  undefined1 in_ZMM8 [64];
  int local_fc;
  long local_d0;
  long local_60;
  long local_50;
  undefined1 auVar29 [32];
  
  uVar10 = kernel_w * kernel_h;
  iVar8 = inch;
  if (outch < 8) {
    if (3 < outch) {
      if (inch < 8) {
        if (inch < 2) {
          iVar7 = (outch & 1U) + 1 + (uint)(((uint)outch >> 1 & 1) != 0);
          _elemsize = 4;
          iVar15 = 4;
        }
        else {
          iVar8 = inch - ((uint)inch >> 1);
          iVar7 = (outch & 1U) + 1 + (uint)(((uint)outch >> 1 & 1) != 0);
          _elemsize = 8;
          iVar15 = 8;
        }
      }
      else {
        iVar8 = (inch & 1U) + ((uint)inch >> 3) + ((uint)inch >> 1 & 3);
        iVar7 = (outch & 1U) + 1 + (uint)(((uint)outch >> 1 & 1) != 0);
        _elemsize = 0x20;
        iVar15 = 0x20;
      }
      goto LAB_002367cc;
    }
    if (outch < 2) {
      iVar7 = outch;
      if (inch < 8) {
        if (inch < 2) {
          _elemsize = 1;
          iVar15 = 1;
        }
        else {
          _elemsize = 2;
          iVar15 = 2;
          iVar8 = inch - ((uint)inch >> 1);
        }
      }
      else {
        _elemsize = 8;
        iVar15 = 8;
        iVar8 = (inch & 1U) + ((uint)inch >> 3) + ((uint)inch >> 1 & 3);
      }
      goto LAB_002367cc;
    }
    if (inch < 8) {
      if (inch < 2) {
        iVar7 = (outch & 1U) + 1;
        _elemsize = 2;
        iVar15 = 2;
      }
      else {
        iVar8 = inch - ((uint)inch >> 1);
        iVar7 = (outch & 1U) + 1;
        _elemsize = 4;
        iVar15 = 4;
      }
      goto LAB_002367cc;
    }
    iVar8 = (inch & 1U) + ((uint)inch >> 3) + ((uint)inch >> 1 & 3);
    iVar7 = (outch & 1U) + 1;
  }
  else {
    if (7 < inch) {
      iVar8 = (inch & 1U) + ((uint)inch >> 3) + ((uint)inch >> 1 & 3);
      iVar7 = (outch & 1U) + ((uint)outch >> 3) + ((uint)outch >> 2 & 1) +
              (uint)(((uint)outch >> 1 & 1) != 0);
      _elemsize = 0x40;
      iVar15 = 0x40;
      goto LAB_002367cc;
    }
    if (inch < 2) {
      iVar7 = (outch & 1U) + ((uint)outch >> 3) + ((uint)outch >> 2 & 1) +
              (uint)(((uint)outch >> 1 & 1) != 0);
      _elemsize = 8;
      iVar15 = 8;
      goto LAB_002367cc;
    }
    iVar8 = inch - ((uint)inch >> 1);
    iVar7 = (outch & 1U) + ((uint)outch >> 3) + ((uint)outch >> 2 & 1) +
            (uint)(((uint)outch >> 1 & 1) != 0);
  }
  _elemsize = 0x10;
  iVar15 = 0x10;
LAB_002367cc:
  Mat::create(kernel_tm,uVar10,iVar8,iVar7,_elemsize,iVar15,(Allocator *)0x0);
  uVar19 = uVar10 * inch;
  lVar3 = (long)(int)uVar10;
  lVar4 = (long)(int)(uVar10 * 2);
  lVar5 = (long)(int)(uVar10 * 8);
  auVar27 = ZEXT464(uVar19);
  auVar25._4_4_ = uVar19;
  auVar25._0_4_ = uVar19;
  auVar25._8_4_ = uVar19;
  auVar25._12_4_ = uVar19;
  auVar33._16_4_ = uVar19;
  auVar33._0_16_ = auVar25;
  auVar33._20_4_ = uVar19;
  auVar33._24_4_ = uVar19;
  auVar33._28_4_ = uVar19;
  auVar25 = vpunpckldq_avx(auVar25,ZEXT416(uVar19 + uVar10));
  auVar25 = vshufps_avx(ZEXT416(uVar10),auVar25,0x41);
  iVar8 = uVar19 * 2;
  auVar30._4_4_ = iVar8;
  auVar30._0_4_ = iVar8;
  auVar30._8_4_ = iVar8;
  auVar30._12_4_ = iVar8;
  auVar25 = vpaddd_avx(auVar30,auVar25);
  auVar32 = ZEXT1664(auVar25);
  vpmulld_avx2(auVar33,_DAT_0053ab40);
  iVar7 = 0;
  uVar22 = 0;
  if (0 < (int)uVar10) {
    uVar22 = (ulong)uVar10;
  }
  lVar11 = (long)outch;
  iVar2 = uVar19 * 8;
  local_fc = uVar19 * 3;
  iVar9 = uVar19 * 7;
  iVar13 = uVar19 * 6;
  iVar15 = uVar19 * 5;
  iVar16 = uVar19 * 4;
  auVar26._16_16_ = _DAT_0053b4c0;
  auVar26._0_16_ = _DAT_0053b4c0;
  uVar12 = uVar19;
  for (uVar24 = 0; (long)(uVar24 | 7) < lVar11; uVar24 = uVar24 + 8) {
    pvVar1 = kernel->data;
    pauVar18 = (undefined1 (*) [16])
               ((uVar24 >> 3) * kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
    local_60 = 0;
    for (uVar20 = 0; (int)(uVar20 | 7) < inch; uVar20 = uVar20 + 8) {
      local_50 = local_60;
      for (uVar14 = 0; uVar14 != uVar22; uVar14 = uVar14 + 1) {
        lVar23 = local_50;
        for (lVar21 = 0; (int)lVar21 != 0x40; lVar21 = lVar21 + 0x10) {
          (*pauVar18)[lVar21] = *(undefined1 *)((long)pvVar1 + lVar23 + iVar7);
          (*pauVar18)[lVar21 + 1] = *(undefined1 *)((long)pvVar1 + lVar23 + iVar7 + lVar3);
          (*pauVar18)[lVar21 + 2] = *(undefined1 *)((long)pvVar1 + lVar23 + (int)uVar12);
          (*pauVar18)[lVar21 + 3] = *(undefined1 *)((long)pvVar1 + lVar23 + (int)uVar12 + lVar3);
          (*pauVar18)[lVar21 + 4] = *(undefined1 *)((long)pvVar1 + lVar23 + iVar8);
          (*pauVar18)[lVar21 + 5] = *(undefined1 *)((long)pvVar1 + lVar23 + iVar8 + lVar3);
          (*pauVar18)[lVar21 + 6] = *(undefined1 *)((long)pvVar1 + lVar23 + local_fc);
          (*pauVar18)[lVar21 + 7] = *(undefined1 *)((long)pvVar1 + lVar23 + local_fc + lVar3);
          (*pauVar18)[lVar21 + 8] = *(undefined1 *)((long)pvVar1 + lVar23 + iVar16);
          (*pauVar18)[lVar21 + 9] = *(undefined1 *)((long)pvVar1 + lVar23 + iVar16 + lVar3);
          (*pauVar18)[lVar21 + 10] = *(undefined1 *)((long)pvVar1 + lVar23 + iVar15);
          (*pauVar18)[lVar21 + 0xb] = *(undefined1 *)((long)pvVar1 + lVar23 + iVar15 + lVar3);
          (*pauVar18)[lVar21 + 0xc] = *(undefined1 *)((long)pvVar1 + lVar23 + iVar13);
          (*pauVar18)[lVar21 + 0xd] = *(undefined1 *)((long)pvVar1 + lVar23 + iVar13 + lVar3);
          (*pauVar18)[lVar21 + 0xe] = *(undefined1 *)((long)pvVar1 + lVar23 + iVar9);
          (*pauVar18)[lVar21 + 0xf] = *(undefined1 *)((long)pvVar1 + lVar23 + iVar9 + lVar3);
          lVar23 = lVar23 + lVar4;
        }
        local_50 = local_50 + 1;
        pauVar18 = (undefined1 (*) [16])(*pauVar18 + lVar21);
      }
      local_60 = local_60 + lVar5;
    }
    for (; (int)(uVar20 | 1) < inch; uVar20 = uVar20 + 2) {
      for (uVar14 = 0; uVar22 != uVar14; uVar14 = uVar14 + 1) {
        auVar33 = vpcmpeqd_avx2(auVar32._0_32_,auVar32._0_32_);
        auVar33 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar33);
        auVar29 = vpshufb_avx2(auVar33,auVar26);
        auVar33 = vpcmpeqd_avx2(auVar33,auVar33);
        auVar33 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar33);
        auVar33 = vpshufb_avx2(auVar33,auVar26);
        auVar25 = vpunpckldq_avx(auVar29._0_16_,auVar29._16_16_);
        in_ZMM8 = ZEXT1664(auVar33._16_16_);
        auVar30 = vpunpckldq_avx(auVar33._0_16_,auVar33._16_16_);
        in_ZMM7 = ZEXT1664(auVar30);
        auVar25 = vpunpcklqdq_avx(auVar25,auVar30);
        auVar32 = ZEXT1664(auVar25);
        *pauVar18 = auVar25;
        pauVar18 = pauVar18 + 1;
      }
    }
    for (; (int)uVar20 < inch; uVar20 = uVar20 + 1) {
      for (uVar14 = 0; uVar22 != uVar14; uVar14 = uVar14 + 1) {
        auVar33 = vpcmpeqd_avx2(auVar32._0_32_,auVar32._0_32_);
        auVar33 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar33);
        auVar33 = vpshufb_avx2(auVar33,auVar26);
        in_ZMM7 = ZEXT1664(auVar33._16_16_);
        auVar25 = vpunpckldq_avx(auVar33._0_16_,auVar33._16_16_);
        auVar32 = ZEXT1664(auVar25);
        *(long *)*pauVar18 = auVar25._0_8_;
        pauVar18 = (undefined1 (*) [16])(*pauVar18 + 8);
      }
    }
    iVar7 = iVar7 + iVar2;
    uVar12 = uVar12 + iVar2;
    iVar8 = iVar8 + iVar2;
    local_fc = local_fc + iVar2;
    iVar9 = iVar9 + iVar2;
    iVar13 = iVar13 + iVar2;
    iVar15 = iVar15 + iVar2;
    iVar16 = iVar16 + iVar2;
  }
  auVar31._4_4_ = uVar19;
  auVar31._0_4_ = uVar19;
  auVar31._8_4_ = uVar19;
  auVar31._12_4_ = uVar19;
  vpmulld_avx(auVar31,_DAT_00539810);
  iVar15 = uVar10 * inch;
  iVar2 = iVar15 * 4;
  for (; (long)(uVar24 | 3) < lVar11; uVar24 = uVar24 + 4) {
    pvVar1 = kernel->data;
    puVar17 = (undefined8 *)
              ((ulong)(((uint)(uVar24 >> 3) & 0x1fffffff) + (uint)(((uint)uVar24 >> 2 & 1) != 0)) *
               kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
    local_d0 = 0;
    for (uVar20 = 0; (int)(uVar20 | 7) < inch; uVar20 = uVar20 + 8) {
      lVar23 = local_d0;
      for (uVar14 = 0; uVar14 != uVar22; uVar14 = uVar14 + 1) {
        lVar21 = lVar23;
        for (lVar6 = 0; (int)lVar6 != 0x20; lVar6 = lVar6 + 8) {
          *(undefined1 *)((long)puVar17 + lVar6) = *(undefined1 *)((long)pvVar1 + lVar21 + iVar7);
          *(undefined1 *)((long)puVar17 + lVar6 + 1) =
               *(undefined1 *)((long)pvVar1 + lVar21 + iVar7 + lVar3);
          *(undefined1 *)((long)puVar17 + lVar6 + 2) =
               *(undefined1 *)((long)pvVar1 + lVar21 + (int)uVar12);
          *(undefined1 *)((long)puVar17 + lVar6 + 3) =
               *(undefined1 *)((long)pvVar1 + lVar21 + (int)uVar12 + lVar3);
          *(undefined1 *)((long)puVar17 + lVar6 + 4) =
               *(undefined1 *)((long)pvVar1 + lVar21 + iVar8);
          *(undefined1 *)((long)puVar17 + lVar6 + 5) =
               *(undefined1 *)((long)pvVar1 + lVar21 + iVar8 + lVar3);
          *(undefined1 *)((long)puVar17 + lVar6 + 6) =
               *(undefined1 *)((long)pvVar1 + lVar21 + local_fc);
          *(undefined1 *)((long)puVar17 + lVar6 + 7) =
               *(undefined1 *)((long)pvVar1 + lVar21 + local_fc + lVar3);
          lVar21 = lVar21 + lVar4;
        }
        puVar17 = (undefined8 *)((long)puVar17 + lVar6);
        lVar23 = lVar23 + 1;
      }
      local_d0 = local_d0 + lVar5;
    }
    for (; (int)(uVar20 | 1) < inch; uVar20 = uVar20 + 2) {
      for (uVar14 = 0; uVar22 != uVar14; uVar14 = uVar14 + 1) {
        auVar33 = vpcmpeqd_avx2(in_ZMM8._0_32_,in_ZMM8._0_32_);
        auVar33 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar33);
        auVar33 = vpshufb_avx2(auVar33,auVar26);
        in_ZMM8 = ZEXT1664(auVar33._16_16_);
        auVar25 = vpunpckldq_avx(auVar33._0_16_,auVar33._16_16_);
        in_ZMM7 = ZEXT1664(auVar25);
        *puVar17 = auVar25._0_8_;
        puVar17 = puVar17 + 1;
      }
    }
    for (; (int)uVar20 < inch; uVar20 = uVar20 + 1) {
      for (uVar14 = 0; uVar22 != uVar14; uVar14 = uVar14 + 1) {
        auVar25 = vpcmpeqd_avx(in_ZMM7._0_16_,in_ZMM7._0_16_);
        auVar25 = vpgatherdd((undefined1  [16])0x0,auVar25);
        in_ZMM8 = ZEXT1664(auVar25);
        auVar25 = vpshufb_avx(auVar25,SUB6416(ZEXT464(0xc080400),0));
        in_ZMM7 = ZEXT1664(auVar25);
        *(int *)puVar17 = auVar25._0_4_;
        puVar17 = (undefined8 *)((long)puVar17 + 4);
      }
    }
    iVar7 = iVar7 + iVar2;
    uVar12 = uVar12 + iVar2;
    iVar8 = iVar8 + iVar2;
    local_fc = local_fc + iVar2;
  }
  auVar28._4_4_ = uVar10;
  auVar28._0_4_ = uVar10;
  auVar28._8_4_ = uVar10;
  auVar28._12_4_ = uVar10;
  auVar29._16_4_ = uVar10;
  auVar29._0_16_ = auVar28;
  auVar29._20_4_ = uVar10;
  auVar29._24_4_ = uVar10;
  auVar29._28_4_ = uVar10;
  vpmulld_avx2(auVar29,_DAT_0053ab40);
  auVar25 = vpunpckldq_avx(auVar28,ZEXT416(uVar19 + uVar10));
  auVar25 = vshufps_avx(ZEXT416(uVar19),auVar25,0x41);
  auVar32 = ZEXT1664(auVar25);
  for (; (long)(uVar24 | 1) < lVar11; uVar24 = uVar24 + 2) {
    lVar23 = (long)(int)(uVar19 * (uint)uVar24) + (long)kernel->data;
    lVar21 = (long)(int)((int)(uVar24 | 1) * uVar19) + (long)kernel->data;
    pauVar18 = (undefined1 (*) [16])
               ((ulong)(((uint)(uVar24 >> 2) & 1) + ((uint)(uVar24 >> 3) & 0x1fffffff) +
                       (uint)(((uint)uVar24 >> 1 & 1) != 0)) * kernel_tm->cstep *
                kernel_tm->elemsize + (long)kernel_tm->data);
    for (uVar10 = 0; (int)(uVar10 | 7) < inch; uVar10 = uVar10 + 8) {
      for (uVar14 = 0; uVar22 != uVar14; uVar14 = uVar14 + 1) {
        auVar33 = vpcmpeqd_avx2(auVar27._0_32_,auVar27._0_32_);
        auVar33 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar33);
        auVar29 = vpshufb_avx2(auVar33,auVar26);
        auVar33 = vpcmpeqd_avx2(auVar33,auVar33);
        auVar33 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar33);
        auVar33 = vpshufb_avx2(auVar33,auVar26);
        auVar25 = vpunpckldq_avx(auVar29._0_16_,auVar29._16_16_);
        auVar30 = vpunpckldq_avx(auVar33._0_16_,auVar33._16_16_);
        auVar25 = vpunpcklqdq_avx(auVar25,auVar30);
        auVar27 = ZEXT1664(auVar25);
        *pauVar18 = auVar25;
        pauVar18 = pauVar18 + 1;
      }
      lVar23 = lVar23 + lVar5;
      lVar21 = lVar21 + lVar5;
    }
    for (; (int)(uVar10 | 1) < inch; uVar10 = uVar10 + 2) {
      for (uVar14 = 0; uVar22 != uVar14; uVar14 = uVar14 + 1) {
        auVar25 = vpcmpeqd_avx(auVar27._0_16_,auVar27._0_16_);
        auVar25 = vpgatherdd((undefined1  [16])0x0,auVar25);
        auVar25 = vpshufb_avx(auVar25,SUB6416(ZEXT464(0xc080400),0));
        auVar27 = ZEXT1664(auVar25);
        *(int *)*pauVar18 = auVar25._0_4_;
        pauVar18 = (undefined1 (*) [16])(*pauVar18 + 4);
      }
      lVar23 = lVar23 + lVar4;
      lVar21 = lVar21 + lVar4;
    }
    for (; (int)uVar10 < inch; uVar10 = uVar10 + 1) {
      for (uVar14 = 0; uVar22 != uVar14; uVar14 = uVar14 + 1) {
        (*pauVar18)[0] = *(undefined1 *)(lVar23 + uVar14);
        (*pauVar18)[1] = *(undefined1 *)(lVar21 + uVar14);
        pauVar18 = (undefined1 (*) [16])(*pauVar18 + 2);
      }
    }
    iVar7 = iVar7 + iVar15 * 2;
  }
  for (; (long)uVar24 < lVar11; uVar24 = uVar24 + 1) {
    uVar10 = (uint)uVar24;
    lVar23 = (long)(int)(uVar19 * uVar10) + (long)kernel->data;
    puVar17 = (undefined8 *)
              ((ulong)((uVar10 & 1) + ((uint)(uVar24 >> 3) & 0x1fffffff) + ((uint)(uVar24 >> 2) & 1)
                      + (uint)((uVar10 >> 1 & 1) != 0)) * kernel_tm->cstep * kernel_tm->elemsize +
              (long)kernel_tm->data);
    lVar21 = iVar7 + lVar3 + (long)kernel->data;
    for (uVar10 = 0; (int)(uVar10 | 7) < inch; uVar10 = uVar10 + 8) {
      for (uVar14 = 0; uVar22 != uVar14; uVar14 = uVar14 + 1) {
        auVar33 = vpcmpeqd_avx2(auVar32._0_32_,auVar32._0_32_);
        auVar33 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar33);
        auVar33 = vpshufb_avx2(auVar33,auVar26);
        auVar25 = vpunpckldq_avx(auVar33._0_16_,auVar33._16_16_);
        auVar32 = ZEXT1664(auVar25);
        *puVar17 = auVar25._0_8_;
        puVar17 = puVar17 + 1;
      }
      lVar23 = lVar23 + lVar5;
      lVar21 = lVar21 + lVar5;
    }
    for (; (int)(uVar10 | 1) < inch; uVar10 = uVar10 + 2) {
      for (uVar14 = 0; uVar22 != uVar14; uVar14 = uVar14 + 1) {
        *(undefined1 *)puVar17 = *(undefined1 *)(lVar23 + uVar14);
        *(undefined1 *)((long)puVar17 + 1) = *(undefined1 *)(lVar21 + uVar14);
        puVar17 = (undefined8 *)((long)puVar17 + 2);
      }
      lVar23 = lVar23 + lVar4;
      lVar21 = lVar21 + lVar4;
    }
    for (; (int)uVar10 < inch; uVar10 = uVar10 + 1) {
      for (uVar14 = 0; uVar22 != uVar14; uVar14 = uVar14 + 1) {
        *(undefined1 *)((long)puVar17 + uVar14) = *(undefined1 *)(lVar23 + uVar14);
      }
      puVar17 = (undefined8 *)((long)puVar17 + uVar14);
    }
    iVar7 = iVar7 + iVar15;
  }
  return;
}

Assistant:

void convolution_transform_kernel_packed_int8_avx2(const Mat& kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    convolution_transform_kernel_packed_int8(kernel, kernel_tm, inch, outch, kernel_w, kernel_h);
}